

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O3

void __thiscall
dgMatrix::TransformTriplex
          (dgMatrix *this,HaF64 *dst,HaI32 dstStrideInBytes,HaF32 *src,HaI32 srcStrideInBytes,
          HaI32 count)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float *pfVar15;
  double *pdVar16;
  undefined8 in_XMM4_Qa;
  undefined1 auVar17 [16];
  undefined8 in_XMM6_Qa;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 in_XMM13_Qb;
  
  if (0 < count) {
    uVar3 = (this->m_front).super_dgTemplateVector<float>.m_x;
    uVar7 = (this->m_front).super_dgTemplateVector<float>.m_y;
    auVar11._4_4_ = uVar7;
    auVar11._0_4_ = uVar3;
    auVar11._8_8_ = 0;
    auVar11 = vcvtps2pd_avx(auVar11);
    uVar4 = (this->m_up).super_dgTemplateVector<float>.m_x;
    uVar8 = (this->m_up).super_dgTemplateVector<float>.m_y;
    auVar12._4_4_ = uVar8;
    auVar12._0_4_ = uVar4;
    auVar12._8_8_ = 0;
    auVar12 = vcvtps2pd_avx(auVar12);
    uVar5 = (this->m_right).super_dgTemplateVector<float>.m_x;
    uVar9 = (this->m_right).super_dgTemplateVector<float>.m_y;
    auVar13._4_4_ = uVar9;
    auVar13._0_4_ = uVar5;
    auVar13._8_8_ = 0;
    auVar13 = vcvtps2pd_avx(auVar13);
    uVar6 = (this->m_posit).super_dgTemplateVector<float>.m_x;
    uVar10 = (this->m_posit).super_dgTemplateVector<float>.m_y;
    auVar14._4_4_ = uVar10;
    auVar14._0_4_ = uVar6;
    auVar14._8_8_ = 0;
    auVar14 = vcvtps2pd_avx(auVar14);
    pfVar15 = (float *)(src + 2);
    pdVar16 = (double *)(dst + 2);
    auVar17._0_8_ = (double)(this->m_front).super_dgTemplateVector<float>.m_z;
    auVar17._8_8_ = in_XMM4_Qa;
    fVar1 = (this->m_up).super_dgTemplateVector<float>.m_z;
    auVar18._0_8_ = (double)(this->m_right).super_dgTemplateVector<float>.m_z;
    auVar18._8_8_ = in_XMM6_Qa;
    fVar2 = (this->m_posit).super_dgTemplateVector<float>.m_z;
    do {
      dVar20 = (double)pfVar15[-1];
      auVar19._0_8_ = (double)pfVar15[-2];
      auVar19._8_8_ = in_XMM13_Qb;
      auVar22._0_8_ = (double)*pfVar15;
      auVar22._8_8_ = in_XMM13_Qb;
      pfVar15 = pfVar15 + (srcStrideInBytes >> 2);
      auVar25._8_8_ = auVar19._0_8_;
      auVar25._0_8_ = auVar19._0_8_;
      auVar23._0_8_ = dVar20 * auVar12._0_8_;
      auVar23._8_8_ = dVar20 * auVar12._8_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar20 * (double)fVar1;
      auVar21 = vfmadd231sd_fma(auVar21,auVar17,auVar19);
      auVar19 = vfmadd213pd_fma(auVar25,auVar11,auVar23);
      auVar24._8_8_ = auVar22._0_8_;
      auVar24._0_8_ = auVar22._0_8_;
      auVar21 = vfmadd231sd_fma(auVar21,auVar18,auVar22);
      auVar19 = vfmadd213pd_fma(auVar24,auVar13,auVar19);
      pdVar16[-2] = auVar19._0_8_ + auVar14._0_8_;
      pdVar16[-1] = auVar19._8_8_ + auVar14._8_8_;
      *pdVar16 = auVar21._0_8_ + (double)fVar2;
      pdVar16 = pdVar16 + (dstStrideInBytes >> 3);
      count = count + -1;
    } while (count != 0);
  }
  return;
}

Assistant:

void dgMatrix::TransformTriplex (hacd::HaF64* const dst, hacd::HaI32 dstStrideInBytes, const hacd::HaF32* const src, hacd::HaI32 srcStrideInBytes, hacd::HaI32 count) const
{
	hacd::HaI32 dstStride = dstStrideInBytes /sizeof (hacd::HaF64);
	hacd::HaI32 srcStride = srcStrideInBytes / sizeof (hacd::HaF32);

	hacd::HaI32 dstIndex = 0;
	hacd::HaI32 srcIndex = 0;
	for (hacd::HaI32 i = 0 ; i < count; i ++ ) {
		hacd::HaF64 x = src[srcIndex + 0];
		hacd::HaF64 y = src[srcIndex + 1];
		hacd::HaF64 z = src[srcIndex + 2];
		srcIndex += srcStride;
		dst[dstIndex + 0] = x * m_front.m_x + y * m_up.m_x + z * m_right.m_x + m_posit.m_x;
		dst[dstIndex + 1] = x * m_front.m_y + y * m_up.m_y + z * m_right.m_y + m_posit.m_y;
		dst[dstIndex + 2] = x * m_front.m_z + y * m_up.m_z + z * m_right.m_z + m_posit.m_z;
		dstIndex += dstStride;
	}
}